

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_maputl.cpp
# Opt level: O1

void __thiscall
FBlockThingsIterator::FBlockThingsIterator
          (FBlockThingsIterator *this,int _minx,int _miny,int _maxx,int _maxy)

{
  HashEntry *pHVar1;
  
  (this->DynHash).Most = 0;
  (this->DynHash).Count = 0;
  pHVar1 = (HashEntry *)
           M_Malloc_Dbg(0,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/tarray.h"
                        ,0x8c);
  (this->DynHash).Array = pHVar1;
  this->minx = _minx;
  this->maxx = _maxx;
  this->miny = _miny;
  this->maxy = _maxy;
  this->Buckets[0] = -1;
  this->Buckets[1] = -1;
  this->Buckets[2] = -1;
  this->Buckets[3] = -1;
  this->Buckets[4] = -1;
  this->Buckets[5] = -1;
  this->Buckets[6] = -1;
  this->Buckets[7] = -1;
  this->Buckets[8] = -1;
  this->Buckets[9] = -1;
  this->Buckets[10] = -1;
  this->Buckets[0xb] = -1;
  this->Buckets[0xc] = -1;
  this->Buckets[0xd] = -1;
  this->Buckets[0xe] = -1;
  this->Buckets[0xf] = -1;
  this->Buckets[0x10] = -1;
  this->Buckets[0x11] = -1;
  this->Buckets[0x12] = -1;
  this->Buckets[0x13] = -1;
  this->Buckets[0x14] = -1;
  this->Buckets[0x15] = -1;
  this->Buckets[0x16] = -1;
  this->Buckets[0x17] = -1;
  this->Buckets[0x18] = -1;
  this->Buckets[0x19] = -1;
  this->Buckets[0x1a] = -1;
  this->Buckets[0x1b] = -1;
  this->Buckets[0x1c] = -1;
  this->Buckets[0x1d] = -1;
  this->Buckets[0x1e] = -1;
  this->Buckets[0x1f] = -1;
  this->NumFixedHash = 0;
  if ((this->DynHash).Count != 0) {
    (this->DynHash).Count = 0;
  }
  Reset(this);
  return;
}

Assistant:

FBlockThingsIterator::FBlockThingsIterator(int _minx, int _miny, int _maxx, int _maxy)
: DynHash(0)
{
	minx = _minx;
	maxx = _maxx;
	miny = _miny;
	maxy = _maxy;
	ClearHash();
	Reset();
}